

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

char * qpdf_get_pdf_version(qpdf_data qpdf)

{
  string local_30;
  
  QPDF::getPDFVersion_abi_cxx11_
            (&local_30,(qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::operator=((string *)&qpdf->tmp_string,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return (qpdf->tmp_string)._M_dataplus._M_p;
}

Assistant:

char const*
qpdf_get_pdf_version(qpdf_data qpdf)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_get_pdf_version");
    qpdf->tmp_string = qpdf->qpdf->getPDFVersion();
    return qpdf->tmp_string.c_str();
}